

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O1

int amrex::CRRBetweenLevels(int fromlevel,int tolevel,Vector<int,_std::allocator<int>_> *refratios)

{
  int iVar1;
  long lVar2;
  int level;
  
  iVar1 = 1;
  if (fromlevel < tolevel) {
    lVar2 = (long)fromlevel;
    do {
      iVar1 = iVar1 * (refratios->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[lVar2];
      lVar2 = lVar2 + 1;
    } while (tolevel != lVar2);
  }
  return iVar1;
}

Assistant:

int amrex::CRRBetweenLevels(int fromlevel, int tolevel,
                            const Vector<int> &refratios)
{
  BL_ASSERT(fromlevel >= 0);
  BL_ASSERT(tolevel >= fromlevel);
  BL_ASSERT(tolevel <= refratios.size());
  int level, rr = 1;
  for(level = fromlevel; level < tolevel; ++level) {
    rr *= refratios[level];
  }
  return rr;
}